

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_cast.cpp
# Opt level: O3

BoundCastInfo *
duckdb::DefaultCasts::StringCastSwitch
          (BoundCastInfo *__return_storage_ptr__,BindCastInput *input,LogicalType *source,
          LogicalType *target)

{
  LogicalTypeId LVar1;
  PhysicalType PVar2;
  InternalException *this;
  uint *puVar3;
  string *this_00;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> _Var4;
  string local_118;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_d8;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_d0;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_c8;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_c0;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_b8;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_b0;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_a8;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_a0;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_98;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_90;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_88;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_80;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_78;
  LogicalType local_70;
  LogicalType local_58;
  LogicalType local_40;
  
  this_00 = &local_118;
  LVar1 = target->id_;
  if (LVar1 < UUID) {
    puVar3 = &switchD_012bb3e5::switchdataD_01df1bd0;
    switch(LVar1) {
    case DATE:
      local_78._M_head_impl = (BoundCastData *)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::
                 TryCastErrorLoop<duckdb::string_t,duckdb::date_t,duckdb::TryCastErrorMessage>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_78,(init_cast_local_state_t)0x0);
      _Var4._M_head_impl = local_78._M_head_impl;
      break;
    case TIME:
      local_80._M_head_impl = (BoundCastData *)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::
                 TryCastErrorLoop<duckdb::string_t,duckdb::dtime_t,duckdb::TryCastErrorMessage>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_80,(init_cast_local_state_t)0x0);
      _Var4._M_head_impl = local_80._M_head_impl;
      break;
    case TIMESTAMP_SEC:
      local_a0._M_head_impl = (BoundCastData *)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::
                 TryCastStrictLoop<duckdb::string_t,duckdb::timestamp_t,duckdb::TryCastToTimestampSec>
                 ,(unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                   *)&local_a0,(init_cast_local_state_t)0x0);
      _Var4._M_head_impl = local_a0._M_head_impl;
      break;
    case TIMESTAMP_MS:
      local_a8._M_head_impl = (BoundCastData *)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::
                 TryCastStrictLoop<duckdb::string_t,duckdb::timestamp_t,duckdb::TryCastToTimestampMS>
                 ,(unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                   *)&local_a8,(init_cast_local_state_t)0x0);
      _Var4._M_head_impl = local_a8._M_head_impl;
      break;
    case TIMESTAMP:
    case TIMESTAMP_TZ:
      local_90._M_head_impl = (BoundCastData *)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::
                 TryCastErrorLoop<duckdb::string_t,duckdb::timestamp_t,duckdb::TryCastErrorMessage>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_90,(init_cast_local_state_t)0x0);
      _Var4._M_head_impl = local_90._M_head_impl;
      break;
    case TIMESTAMP_NS:
      local_98._M_head_impl = (BoundCastData *)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::
                 TryCastStrictLoop<duckdb::string_t,duckdb::timestamp_ns_t,duckdb::TryCastToTimestampNS>
                 ,(unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                   *)&local_98,(init_cast_local_state_t)0x0);
      _Var4._M_head_impl = local_98._M_head_impl;
      break;
    case DECIMAL:
    case FLOAT:
    case DOUBLE:
    case CHAR:
    case INTERVAL:
    case UTINYINT:
    case USMALLINT:
    case UINTEGER:
    case UBIGINT:
    case TIMESTAMP_TZ|SQLNULL:
    case TIME_TZ|SQLNULL:
    case STRING_LITERAL:
    case INTEGER_LITERAL:
      goto switchD_012bb3e5_caseD_15;
    case VARCHAR:
      local_d0._M_head_impl = (BoundCastData *)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,ReinterpretCast,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_d0,(init_cast_local_state_t)0x0);
      _Var4._M_head_impl = local_d0._M_head_impl;
      break;
    case BLOB:
      local_b0._M_head_impl = (BoundCastData *)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::
                 TryCastStringLoop<duckdb::string_t,duckdb::string_t,duckdb::TryCastToBlob>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_b0,(init_cast_local_state_t)0x0);
      _Var4._M_head_impl = local_b0._M_head_impl;
      break;
    case TIME_TZ:
      local_88._M_head_impl = (BoundCastData *)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::
                 TryCastErrorLoop<duckdb::string_t,duckdb::dtime_tz_t,duckdb::TryCastErrorMessage>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_88,(init_cast_local_state_t)0x0);
      _Var4._M_head_impl = local_88._M_head_impl;
      break;
    case BIT:
      local_b8._M_head_impl = (BoundCastData *)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::
                 TryCastStringLoop<duckdb::string_t,duckdb::string_t,duckdb::TryCastToBit>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_b8,(init_cast_local_state_t)0x0);
      _Var4._M_head_impl = local_b8._M_head_impl;
      break;
    case VARINT:
      local_d8._M_head_impl = (BoundCastData *)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::
                 TryCastStringLoop<duckdb::string_t,duckdb::string_t,duckdb::TryCastToVarInt>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_d8,(init_cast_local_state_t)0x0);
      _Var4._M_head_impl = local_d8._M_head_impl;
      break;
    default:
      puVar3 = (uint *)source;
      if (LVar1 == SQLNULL) {
        local_c8._M_head_impl = (BoundCastData *)0x0;
        BoundCastInfo::BoundCastInfo
                  (__return_storage_ptr__,TryVectorNullCast,
                   (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                    *)&local_c8,(init_cast_local_state_t)0x0);
        _Var4._M_head_impl = local_c8._M_head_impl;
        break;
      }
      goto switchD_012bb3e5_caseD_15;
    }
    goto LAB_012bbacf;
  }
  puVar3 = &switchD_012bb431::switchdataD_01df1c34;
  switch(LVar1) {
  case STRUCT:
    InitVarcharStructType((LogicalType *)&local_118,target);
    StructBoundCastData::BindStructToStructCast
              ((StructBoundCastData *)(local_f8 + 8),input,(LogicalType *)&local_118,target);
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,StringToNestedTypeCast<duckdb::VectorStringToStruct>,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)(local_f8 + 8),StructBoundCastData::InitStructCastLocalState);
    if ((cast_function_t)local_f8._8_8_ != (cast_function_t)0x0) {
      (**(code **)(*(long *)local_f8._8_8_ + 8))();
    }
    local_f8._8_8_ = (cast_function_t)0x0;
    goto LAB_012bb6b9;
  case LIST:
    LogicalType::LogicalType(&local_70,VARCHAR);
    LogicalType::LIST((LogicalType *)&local_118,&local_70);
    ListBoundCastData::BindListToListCast
              ((ListBoundCastData *)(local_e8 + 8),input,(LogicalType *)&local_118,target);
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,StringToNestedTypeCast<duckdb::VectorStringToList>,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)(local_e8 + 8),ListBoundCastData::InitListLocalState);
    if ((__uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>)
        local_e8._8_8_ !=
        (__uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>)0x0) {
      (*(*(_func_int ***)local_e8._8_8_)[1])();
    }
    local_e8._8_8_ =
         (__uniq_ptr_data<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true,_true>
          )0x0;
    break;
  case MAP:
    LogicalType::LogicalType(&local_40,VARCHAR);
    LogicalType::LogicalType(&local_58,VARCHAR);
    LogicalType::MAP((LogicalType *)&local_118,&local_40,&local_58);
    MapBoundCastData::BindMapToMapCast
              ((MapBoundCastData *)local_f8,input,(LogicalType *)&local_118,target);
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,StringToNestedTypeCast<duckdb::VectorStringToMap>,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)local_f8,InitMapCastLocalState);
    if ((_func_int **)local_f8._0_8_ != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)local_f8._0_8_ + 8))();
    }
    local_f8._0_8_ = (_func_int **)0x0;
    LogicalType::~LogicalType((LogicalType *)&local_118);
    LogicalType::~LogicalType(&local_58);
    this_00 = (string *)&local_40;
    goto LAB_012bb6b9;
  case TABLE:
  case ENUM:
  case AGGREGATE_STATE:
  case LAMBDA:
  case UNION:
    goto switchD_012bb3e5_caseD_15;
  case ARRAY:
    LogicalType::LogicalType(&local_70,VARCHAR);
    LogicalType::ARRAY((LogicalType *)&local_118,&local_70,(optional_idx)0xffffffffffffffff);
    ArrayBoundCastData::BindArrayToArrayCast
              ((ArrayBoundCastData *)local_e8,input,(LogicalType *)&local_118,target);
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,StringToNestedTypeCast<duckdb::VectorStringToArray>,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)local_e8,ArrayBoundCastData::InitArrayLocalState);
    if ((_func_int **)local_e8._0_8_ != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)local_e8._0_8_ + 8))();
    }
    local_e8._0_8_ = (_func_int **)0x0;
    break;
  default:
    puVar3 = (uint *)source;
    if (LVar1 == UUID) {
      local_c0._M_head_impl = (BoundCastData *)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::
                 TryCastStringLoop<duckdb::string_t,duckdb::hugeint_t,duckdb::TryCastToUUID>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_c0,(init_cast_local_state_t)0x0);
      _Var4._M_head_impl = local_c0._M_head_impl;
      goto LAB_012bbacf;
    }
switchD_012bb3e5_caseD_15:
    if (LVar1 < UHUGEINT) {
      switch(LVar1) {
      case BOOLEAN:
        local_118._M_dataplus._M_p = (pointer)0x0;
        BoundCastInfo::BoundCastInfo
                  (__return_storage_ptr__,
                   VectorCastHelpers::TryCastStrictLoop<duckdb::string_t,bool,duckdb::TryCast>,
                   (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                    *)&local_118,(init_cast_local_state_t)0x0);
        _Var4._M_head_impl = (BoundCastData *)local_118._M_dataplus._M_p;
        break;
      case TINYINT:
        local_118._M_dataplus._M_p = (pointer)0x0;
        BoundCastInfo::BoundCastInfo
                  (__return_storage_ptr__,
                   VectorCastHelpers::
                   TryCastStrictLoop<duckdb::string_t,signed_char,duckdb::TryCast>,
                   (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                    *)&local_118,(init_cast_local_state_t)0x0);
        _Var4._M_head_impl = (BoundCastData *)local_118._M_dataplus._M_p;
        break;
      case SMALLINT:
        local_118._M_dataplus._M_p = (pointer)0x0;
        BoundCastInfo::BoundCastInfo
                  (__return_storage_ptr__,
                   VectorCastHelpers::TryCastStrictLoop<duckdb::string_t,short,duckdb::TryCast>,
                   (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                    *)&local_118,(init_cast_local_state_t)0x0);
        _Var4._M_head_impl = (BoundCastData *)local_118._M_dataplus._M_p;
        break;
      case INTEGER:
        local_118._M_dataplus._M_p = (pointer)0x0;
        BoundCastInfo::BoundCastInfo
                  (__return_storage_ptr__,
                   VectorCastHelpers::TryCastStrictLoop<duckdb::string_t,int,duckdb::TryCast>,
                   (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                    *)&local_118,(init_cast_local_state_t)0x0);
        _Var4._M_head_impl = (BoundCastData *)local_118._M_dataplus._M_p;
        break;
      case BIGINT:
        local_118._M_dataplus._M_p = (pointer)0x0;
        BoundCastInfo::BoundCastInfo
                  (__return_storage_ptr__,
                   VectorCastHelpers::TryCastStrictLoop<duckdb::string_t,long,duckdb::TryCast>,
                   (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                    *)&local_118,(init_cast_local_state_t)0x0);
        _Var4._M_head_impl = (BoundCastData *)local_118._M_dataplus._M_p;
        break;
      default:
        goto switchD_012bb50b_caseD_f;
      case DECIMAL:
        local_118._M_dataplus._M_p = (pointer)0x0;
        BoundCastInfo::BoundCastInfo
                  (__return_storage_ptr__,VectorCastHelpers::ToDecimalCast<duckdb::string_t>,
                   (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                    *)&local_118,(init_cast_local_state_t)0x0);
        _Var4._M_head_impl = (BoundCastData *)local_118._M_dataplus._M_p;
        break;
      case FLOAT:
        local_118._M_dataplus._M_p = (pointer)0x0;
        BoundCastInfo::BoundCastInfo
                  (__return_storage_ptr__,
                   VectorCastHelpers::TryCastStrictLoop<duckdb::string_t,float,duckdb::TryCast>,
                   (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                    *)&local_118,(init_cast_local_state_t)0x0);
        _Var4._M_head_impl = (BoundCastData *)local_118._M_dataplus._M_p;
        break;
      case DOUBLE:
        local_118._M_dataplus._M_p = (pointer)0x0;
        BoundCastInfo::BoundCastInfo
                  (__return_storage_ptr__,
                   VectorCastHelpers::TryCastStrictLoop<duckdb::string_t,double,duckdb::TryCast>,
                   (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                    *)&local_118,(init_cast_local_state_t)0x0);
        _Var4._M_head_impl = (BoundCastData *)local_118._M_dataplus._M_p;
        break;
      case INTERVAL:
        local_118._M_dataplus._M_p = (pointer)0x0;
        BoundCastInfo::BoundCastInfo
                  (__return_storage_ptr__,
                   VectorCastHelpers::
                   TryCastErrorLoop<duckdb::string_t,duckdb::interval_t,duckdb::TryCastErrorMessage>
                   ,(unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                     *)&local_118,(init_cast_local_state_t)0x0);
        _Var4._M_head_impl = (BoundCastData *)local_118._M_dataplus._M_p;
        break;
      case UTINYINT:
        local_118._M_dataplus._M_p = (pointer)0x0;
        BoundCastInfo::BoundCastInfo
                  (__return_storage_ptr__,
                   VectorCastHelpers::
                   TryCastStrictLoop<duckdb::string_t,unsigned_char,duckdb::TryCast>,
                   (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                    *)&local_118,(init_cast_local_state_t)0x0);
        _Var4._M_head_impl = (BoundCastData *)local_118._M_dataplus._M_p;
        break;
      case USMALLINT:
        local_118._M_dataplus._M_p = (pointer)0x0;
        BoundCastInfo::BoundCastInfo
                  (__return_storage_ptr__,
                   VectorCastHelpers::
                   TryCastStrictLoop<duckdb::string_t,unsigned_short,duckdb::TryCast>,
                   (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                    *)&local_118,(init_cast_local_state_t)0x0);
        _Var4._M_head_impl = (BoundCastData *)local_118._M_dataplus._M_p;
        break;
      case UINTEGER:
        local_118._M_dataplus._M_p = (pointer)0x0;
        BoundCastInfo::BoundCastInfo
                  (__return_storage_ptr__,
                   VectorCastHelpers::
                   TryCastStrictLoop<duckdb::string_t,unsigned_int,duckdb::TryCast>,
                   (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                    *)&local_118,(init_cast_local_state_t)0x0);
        _Var4._M_head_impl = (BoundCastData *)local_118._M_dataplus._M_p;
        break;
      case UBIGINT:
        local_118._M_dataplus._M_p = (pointer)0x0;
        BoundCastInfo::BoundCastInfo
                  (__return_storage_ptr__,
                   VectorCastHelpers::
                   TryCastStrictLoop<duckdb::string_t,unsigned_long,duckdb::TryCast>,
                   (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                    *)&local_118,(init_cast_local_state_t)0x0);
        _Var4._M_head_impl = (BoundCastData *)local_118._M_dataplus._M_p;
      }
    }
    else {
      if (LVar1 == UHUGEINT) {
        local_118._M_dataplus._M_p = (pointer)0x0;
        BoundCastInfo::BoundCastInfo
                  (__return_storage_ptr__,
                   VectorCastHelpers::
                   TryCastStrictLoop<duckdb::string_t,duckdb::uhugeint_t,duckdb::TryCast>,
                   (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                    *)&local_118,(init_cast_local_state_t)0x0);
        _Var4._M_head_impl = (BoundCastData *)local_118._M_dataplus._M_p;
        goto LAB_012bbacf;
      }
      if (LVar1 == HUGEINT) {
        local_118._M_dataplus._M_p = (pointer)0x0;
        BoundCastInfo::BoundCastInfo
                  (__return_storage_ptr__,
                   VectorCastHelpers::
                   TryCastStrictLoop<duckdb::string_t,duckdb::hugeint_t,duckdb::TryCast>,
                   (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                    *)&local_118,(init_cast_local_state_t)0x0);
        _Var4._M_head_impl = (BoundCastData *)local_118._M_dataplus._M_p;
        goto LAB_012bbacf;
      }
      if (LVar1 == ENUM) {
        PVar2 = target->physical_type_;
        if (PVar2 == UINT32) {
          local_118._M_dataplus._M_p = (pointer)0x0;
          BoundCastInfo::BoundCastInfo
                    (__return_storage_ptr__,StringEnumCast<unsigned_int>,
                     (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                      *)&local_118,(init_cast_local_state_t)0x0);
          _Var4._M_head_impl = (BoundCastData *)local_118._M_dataplus._M_p;
        }
        else if (PVar2 == UINT16) {
          local_118._M_dataplus._M_p = (pointer)0x0;
          BoundCastInfo::BoundCastInfo
                    (__return_storage_ptr__,StringEnumCast<unsigned_short>,
                     (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                      *)&local_118,(init_cast_local_state_t)0x0);
          _Var4._M_head_impl = (BoundCastData *)local_118._M_dataplus._M_p;
        }
        else {
          if (PVar2 != UINT8) {
            this = (InternalException *)__cxa_allocate_exception(0x10,input,puVar3);
            local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_118,
                       "ENUM can only have unsigned integers (except UINT64) as physical types","");
            InternalException::InternalException(this,&local_118);
            __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
          }
          local_118._M_dataplus._M_p = (pointer)0x0;
          BoundCastInfo::BoundCastInfo
                    (__return_storage_ptr__,StringEnumCast<unsigned_char>,
                     (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                      *)&local_118,(init_cast_local_state_t)0x0);
          _Var4._M_head_impl = (BoundCastData *)local_118._M_dataplus._M_p;
        }
        goto LAB_012bbacf;
      }
switchD_012bb50b_caseD_f:
      local_118._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,TryVectorNullCast,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_118,(init_cast_local_state_t)0x0);
      _Var4._M_head_impl = (BoundCastData *)local_118._M_dataplus._M_p;
    }
LAB_012bbacf:
    if ((tuple<duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>)
        _Var4._M_head_impl == (_Head_base<0UL,_duckdb::BoundCastData_*,_false>)0x0) {
      return __return_storage_ptr__;
    }
    (*(_Var4._M_head_impl)->_vptr_BoundCastData[1])();
    return __return_storage_ptr__;
  }
  LogicalType::~LogicalType((LogicalType *)&local_118);
  this_00 = (string *)&local_70;
LAB_012bb6b9:
  LogicalType::~LogicalType((LogicalType *)this_00);
  return __return_storage_ptr__;
}

Assistant:

BoundCastInfo DefaultCasts::StringCastSwitch(BindCastInput &input, const LogicalType &source,
                                             const LogicalType &target) {
	switch (target.id()) {
	case LogicalTypeId::DATE:
		return BoundCastInfo(&VectorCastHelpers::TryCastErrorLoop<string_t, date_t, duckdb::TryCastErrorMessage>);
	case LogicalTypeId::TIME:
		return BoundCastInfo(&VectorCastHelpers::TryCastErrorLoop<string_t, dtime_t, duckdb::TryCastErrorMessage>);
	case LogicalTypeId::TIME_TZ:
		return BoundCastInfo(&VectorCastHelpers::TryCastErrorLoop<string_t, dtime_tz_t, duckdb::TryCastErrorMessage>);
	case LogicalTypeId::TIMESTAMP:
	case LogicalTypeId::TIMESTAMP_TZ:
		return BoundCastInfo(&VectorCastHelpers::TryCastErrorLoop<string_t, timestamp_t, duckdb::TryCastErrorMessage>);
	case LogicalTypeId::TIMESTAMP_NS:
		return BoundCastInfo(
		    &VectorCastHelpers::TryCastStrictLoop<string_t, timestamp_ns_t, duckdb::TryCastToTimestampNS>);
	case LogicalTypeId::TIMESTAMP_SEC:
		return BoundCastInfo(
		    &VectorCastHelpers::TryCastStrictLoop<string_t, timestamp_t, duckdb::TryCastToTimestampSec>);
	case LogicalTypeId::TIMESTAMP_MS:
		return BoundCastInfo(
		    &VectorCastHelpers::TryCastStrictLoop<string_t, timestamp_t, duckdb::TryCastToTimestampMS>);
	case LogicalTypeId::BLOB:
		return BoundCastInfo(&VectorCastHelpers::TryCastStringLoop<string_t, string_t, duckdb::TryCastToBlob>);
	case LogicalTypeId::BIT:
		return BoundCastInfo(&VectorCastHelpers::TryCastStringLoop<string_t, string_t, duckdb::TryCastToBit>);
	case LogicalTypeId::UUID:
		return BoundCastInfo(&VectorCastHelpers::TryCastStringLoop<string_t, hugeint_t, duckdb::TryCastToUUID>);
	case LogicalTypeId::SQLNULL:
		return &DefaultCasts::TryVectorNullCast;
	case LogicalTypeId::VARCHAR:
		return &DefaultCasts::ReinterpretCast;
	case LogicalTypeId::LIST:
		// the second argument allows for a secondary casting function to be passed in the CastParameters
		return BoundCastInfo(
		    &StringToNestedTypeCast<VectorStringToList>,
		    ListBoundCastData::BindListToListCast(input, LogicalType::LIST(LogicalType::VARCHAR), target),
		    ListBoundCastData::InitListLocalState);
	case LogicalTypeId::ARRAY:
		// the second argument allows for a secondary casting function to be passed in the CastParameters
		return BoundCastInfo(&StringToNestedTypeCast<VectorStringToArray>,
		                     ArrayBoundCastData::BindArrayToArrayCast(
		                         input, LogicalType::ARRAY(LogicalType::VARCHAR, optional_idx()), target),
		                     ArrayBoundCastData::InitArrayLocalState);
	case LogicalTypeId::STRUCT:
		return BoundCastInfo(&StringToNestedTypeCast<VectorStringToStruct>,
		                     StructBoundCastData::BindStructToStructCast(input, InitVarcharStructType(target), target),
		                     StructBoundCastData::InitStructCastLocalState);
	case LogicalTypeId::MAP:
		return BoundCastInfo(&StringToNestedTypeCast<VectorStringToMap>,
		                     MapBoundCastData::BindMapToMapCast(
		                         input, LogicalType::MAP(LogicalType::VARCHAR, LogicalType::VARCHAR), target),
		                     InitMapCastLocalState);
	case LogicalTypeId::VARINT:
		return BoundCastInfo(&VectorCastHelpers::TryCastStringLoop<string_t, string_t, TryCastToVarInt>);
	default:
		return VectorStringCastNumericSwitch(input, source, target);
	}
}